

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o_init.c
# Opt level: O3

void setgemprobs(d_level *dlev)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  xchar xVar5;
  xchar xVar6;
  char cVar7;
  ulong uVar8;
  int iVar9;
  short *psVar10;
  uint uVar11;
  long lVar12;
  int iVar14;
  undefined1 auVar13 [16];
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int iVar33;
  int iVar34;
  int iVar37;
  undefined1 auVar35 [16];
  int iVar38;
  undefined1 auVar36 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar41 [16];
  
  if (dlev == (d_level *)0x0) {
    uVar11 = 9;
  }
  else {
    xVar5 = ledger_no(dlev);
    xVar6 = maxledgerno();
    if (xVar6 < xVar5) {
      cVar7 = maxledgerno();
    }
    else {
      cVar7 = ledger_no(dlev);
    }
    uVar11 = 0;
    iVar9 = bases[0xd];
    if ('\x1a' < cVar7) goto LAB_0020a4f0;
    cVar7 = (char)((uint)(cVar7 * 0x55) >> 8) - cVar7;
    uVar11 = (uint)(char)(((cVar7 >> 1) - (cVar7 >> 7)) + '\t');
  }
  iVar9 = bases[0xd];
  auVar4 = _DAT_002aba20;
  uVar8 = (ulong)(uVar11 + 7 & 0xfffffff8);
  lVar12 = (ulong)uVar11 - 1;
  auVar13._8_4_ = (int)lVar12;
  auVar13._0_8_ = lVar12;
  auVar13._12_4_ = (int)((ulong)lVar12 >> 0x20);
  psVar10 = &objects[(long)bases[0xd] + 7].oc_prob;
  auVar13 = auVar13 ^ _DAT_002aba20;
  auVar16 = _DAT_002ae000;
  auVar17 = _DAT_002ae010;
  auVar18 = _DAT_002ae020;
  auVar19 = _DAT_002aba10;
  do {
    auVar20 = auVar19 ^ auVar4;
    iVar34 = auVar13._0_4_;
    iVar33 = -(uint)(iVar34 < auVar20._0_4_);
    iVar14 = auVar13._4_4_;
    auVar21._4_4_ = -(uint)(iVar14 < auVar20._4_4_);
    iVar38 = auVar13._8_4_;
    iVar37 = -(uint)(iVar38 < auVar20._8_4_);
    iVar15 = auVar13._12_4_;
    auVar21._12_4_ = -(uint)(iVar15 < auVar20._12_4_);
    auVar30._4_4_ = iVar33;
    auVar30._0_4_ = iVar33;
    auVar30._8_4_ = iVar37;
    auVar30._12_4_ = iVar37;
    auVar39 = pshuflw(in_XMM11,auVar30,0xe8);
    auVar23._4_4_ = -(uint)(auVar20._4_4_ == iVar14);
    auVar23._12_4_ = -(uint)(auVar20._12_4_ == iVar15);
    auVar23._0_4_ = auVar23._4_4_;
    auVar23._8_4_ = auVar23._12_4_;
    auVar41 = pshuflw(in_XMM12,auVar23,0xe8);
    auVar21._0_4_ = auVar21._4_4_;
    auVar21._8_4_ = auVar21._12_4_;
    auVar40 = pshuflw(auVar39,auVar21,0xe8);
    auVar20._8_4_ = 0xffffffff;
    auVar20._0_8_ = 0xffffffffffffffff;
    auVar20._12_4_ = 0xffffffff;
    auVar20 = (auVar40 | auVar41 & auVar39) ^ auVar20;
    auVar20 = packssdw(auVar20,auVar20);
    if ((auVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      psVar10[-0x8c] = 0;
    }
    auVar21 = auVar23 & auVar30 | auVar21;
    auVar20 = packssdw(auVar21,auVar21);
    auVar40._8_4_ = 0xffffffff;
    auVar40._0_8_ = 0xffffffffffffffff;
    auVar40._12_4_ = 0xffffffff;
    auVar20 = packssdw(auVar20 ^ auVar40,auVar20 ^ auVar40);
    if ((auVar20._0_4_ >> 0x10 & 1) != 0) {
      psVar10[-0x78] = 0;
    }
    auVar20 = auVar18 ^ auVar4;
    iVar33 = -(uint)(iVar34 < auVar20._0_4_);
    auVar35._4_4_ = -(uint)(iVar14 < auVar20._4_4_);
    iVar37 = -(uint)(iVar38 < auVar20._8_4_);
    auVar35._12_4_ = -(uint)(iVar15 < auVar20._12_4_);
    auVar22._4_4_ = iVar33;
    auVar22._0_4_ = iVar33;
    auVar22._8_4_ = iVar37;
    auVar22._12_4_ = iVar37;
    auVar29._4_4_ = -(uint)(auVar20._4_4_ == iVar14);
    auVar29._12_4_ = -(uint)(auVar20._12_4_ == iVar15);
    auVar29._0_4_ = auVar29._4_4_;
    auVar29._8_4_ = auVar29._12_4_;
    auVar35._0_4_ = auVar35._4_4_;
    auVar35._8_4_ = auVar35._12_4_;
    auVar20 = auVar29 & auVar22 | auVar35;
    auVar20 = packssdw(auVar20,auVar20);
    auVar2._8_4_ = 0xffffffff;
    auVar2._0_8_ = 0xffffffffffffffff;
    auVar2._12_4_ = 0xffffffff;
    auVar20 = packssdw(auVar20 ^ auVar2,auVar20 ^ auVar2);
    if ((auVar20 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      psVar10[-100] = 0;
    }
    auVar23 = pshufhw(auVar22,auVar22,0x84);
    auVar30 = pshufhw(auVar29,auVar29,0x84);
    auVar21 = pshufhw(auVar23,auVar35,0x84);
    auVar24._8_4_ = 0xffffffff;
    auVar24._0_8_ = 0xffffffffffffffff;
    auVar24._12_4_ = 0xffffffff;
    auVar24 = (auVar21 | auVar30 & auVar23) ^ auVar24;
    auVar23 = packssdw(auVar24,auVar24);
    if ((auVar23 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      psVar10[-0x50] = 0;
    }
    auVar23 = auVar17 ^ auVar4;
    iVar33 = -(uint)(iVar34 < auVar23._0_4_);
    auVar26._4_4_ = -(uint)(iVar14 < auVar23._4_4_);
    iVar37 = -(uint)(iVar38 < auVar23._8_4_);
    auVar26._12_4_ = -(uint)(iVar15 < auVar23._12_4_);
    auVar31._4_4_ = iVar33;
    auVar31._0_4_ = iVar33;
    auVar31._8_4_ = iVar37;
    auVar31._12_4_ = iVar37;
    auVar20 = pshuflw(auVar20,auVar31,0xe8);
    auVar25._4_4_ = -(uint)(auVar23._4_4_ == iVar14);
    auVar25._12_4_ = -(uint)(auVar23._12_4_ == iVar15);
    auVar25._0_4_ = auVar25._4_4_;
    auVar25._8_4_ = auVar25._12_4_;
    auVar23 = pshuflw(auVar41 & auVar39,auVar25,0xe8);
    in_XMM12 = auVar23 & auVar20;
    auVar26._0_4_ = auVar26._4_4_;
    auVar26._8_4_ = auVar26._12_4_;
    auVar20 = pshuflw(auVar20,auVar26,0xe8);
    auVar39._8_4_ = 0xffffffff;
    auVar39._0_8_ = 0xffffffffffffffff;
    auVar39._12_4_ = 0xffffffff;
    auVar39 = (auVar20 | in_XMM12) ^ auVar39;
    auVar20 = packssdw(auVar39,auVar39);
    if ((auVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      psVar10[-0x3c] = 0;
    }
    auVar26 = auVar25 & auVar31 | auVar26;
    auVar20 = packssdw(auVar26,auVar26);
    auVar41._8_4_ = 0xffffffff;
    auVar41._0_8_ = 0xffffffffffffffff;
    auVar41._12_4_ = 0xffffffff;
    auVar20 = packssdw(auVar20 ^ auVar41,auVar20 ^ auVar41);
    if ((auVar20 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      psVar10[-0x28] = 0;
    }
    auVar20 = auVar16 ^ auVar4;
    iVar34 = -(uint)(iVar34 < auVar20._0_4_);
    auVar36._4_4_ = -(uint)(iVar14 < auVar20._4_4_);
    iVar38 = -(uint)(iVar38 < auVar20._8_4_);
    auVar36._12_4_ = -(uint)(iVar15 < auVar20._12_4_);
    auVar27._4_4_ = iVar34;
    auVar27._0_4_ = iVar34;
    auVar27._8_4_ = iVar38;
    auVar27._12_4_ = iVar38;
    auVar32._4_4_ = -(uint)(auVar20._4_4_ == iVar14);
    auVar32._12_4_ = -(uint)(auVar20._12_4_ == iVar15);
    auVar32._0_4_ = auVar32._4_4_;
    auVar32._8_4_ = auVar32._12_4_;
    auVar36._0_4_ = auVar36._4_4_;
    auVar36._8_4_ = auVar36._12_4_;
    auVar20 = auVar32 & auVar27 | auVar36;
    auVar20 = packssdw(auVar20,auVar20);
    auVar3._8_4_ = 0xffffffff;
    auVar3._0_8_ = 0xffffffffffffffff;
    auVar3._12_4_ = 0xffffffff;
    in_XMM11 = packssdw(auVar20 ^ auVar3,auVar20 ^ auVar3);
    if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      psVar10[-0x14] = 0;
    }
    auVar20 = pshufhw(auVar27,auVar27,0x84);
    auVar21 = pshufhw(auVar32,auVar32,0x84);
    auVar23 = pshufhw(auVar20,auVar36,0x84);
    auVar28._8_4_ = 0xffffffff;
    auVar28._0_8_ = 0xffffffffffffffff;
    auVar28._12_4_ = 0xffffffff;
    auVar28 = (auVar23 | auVar21 & auVar20) ^ auVar28;
    auVar20 = packssdw(auVar28,auVar28);
    if ((auVar20 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *psVar10 = 0;
    }
    lVar12 = auVar19._8_8_;
    auVar19._0_8_ = auVar19._0_8_ + 8;
    auVar19._8_8_ = lVar12 + 8;
    lVar12 = auVar18._8_8_;
    auVar18._0_8_ = auVar18._0_8_ + 8;
    auVar18._8_8_ = lVar12 + 8;
    lVar12 = auVar17._8_8_;
    auVar17._0_8_ = auVar17._0_8_ + 8;
    auVar17._8_8_ = lVar12 + 8;
    lVar12 = auVar16._8_8_;
    auVar16._0_8_ = auVar16._0_8_ + 8;
    auVar16._8_8_ = lVar12 + 8;
    psVar10 = psVar10 + 0xa0;
    uVar8 = uVar8 - 8;
  } while (uVar8 != 0);
LAB_0020a4f0:
  uVar1 = uVar11 + iVar9;
  if (0x205 < (int)uVar1) {
    raw_printf("Not enough gems? - first=%d j=%d LAST_GEM=%d\n",(ulong)uVar1,(ulong)uVar11,0x205);
    return;
  }
  if ((objects[(int)uVar1].oc_class != '\r') ||
     (obj_descr[objects[(int)uVar1].oc_name_idx].oc_name == (char *)0x0)) {
    raw_printf("Not enough gems? - first=%d j=%d LAST_GEM=%d\n",(ulong)uVar1,(ulong)uVar11,0x205);
  }
  psVar10 = &objects[(long)iVar9 + (ulong)uVar11].oc_prob;
  lVar12 = (long)iVar9 + (ulong)uVar11;
  iVar9 = 0xab;
  do {
    lVar12 = lVar12 + 1;
    *psVar10 = (short)(iVar9 / (int)(0x206 - uVar1));
    iVar9 = iVar9 + 1;
    psVar10 = psVar10 + 0x14;
  } while ((int)lVar12 != 0x206);
  return;
}

Assistant:

static void setgemprobs(const d_level *dlev)
{
	int j, first, lev;

	if (dlev)
	    lev = (ledger_no(dlev) > maxledgerno())
				? maxledgerno() : ledger_no(dlev);
	else
	    lev = 0;
	first = bases[GEM_CLASS];

	for (j = 0; j < 9-lev/3; j++)
		objects[first+j].oc_prob = 0;
	first += j;
	if (first > LAST_GEM || objects[first].oc_class != GEM_CLASS ||
	    OBJ_NAME(objects[first]) == NULL) {
		raw_printf("Not enough gems? - first=%d j=%d LAST_GEM=%d\n",
			first, j, LAST_GEM);
	    }
	for (j = first; j <= LAST_GEM; j++)
		objects[j].oc_prob = (171+j-first)/(LAST_GEM+1-first);
}